

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O0

void __thiscall
Am_Load_Save_Context_Data::~Am_Load_Save_Context_Data(Am_Load_Save_Context_Data *this)

{
  Map<const_char_*,_Am_Load_Method,_lex_less<const_char_*>_> *this_00;
  Map<unsigned_short,_Am_Save_Method,_std::less<unsigned_short>_> *this_01;
  Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *this_02;
  Map<Wrapper_Holder,_Name_Num,_std::less<Wrapper_Holder>_> *this_03;
  Map<int,_Wrapper_Holder,_std::less<int>_> *this_04;
  Map<Wrapper_Holder,_int,_std::less<Wrapper_Holder>_> *this_05;
  Am_Load_Save_Context_Data *this_local;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00410d80;
  OpenAmulet::Map<const_char_*,_Am_Load_Method,_lex_less<const_char_*>_>::Clear(this->loader);
  this_00 = this->loader;
  if (this_00 != (Map<const_char_*,_Am_Load_Method,_lex_less<const_char_*>_> *)0x0) {
    OpenAmulet::Map<const_char_*,_Am_Load_Method,_lex_less<const_char_*>_>::~Map(this_00);
    operator_delete(this_00);
  }
  OpenAmulet::Map<unsigned_short,_Am_Save_Method,_std::less<unsigned_short>_>::Clear(this->saver);
  this_01 = this->saver;
  if (this_01 != (Map<unsigned_short,_Am_Save_Method,_std::less<unsigned_short>_> *)0x0) {
    OpenAmulet::Map<unsigned_short,_Am_Save_Method,_std::less<unsigned_short>_>::~Map(this_01);
    operator_delete(this_01);
  }
  OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::Clear(this->prototypes);
  this_02 = this->prototypes;
  if (this_02 != (Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *)0x0) {
    OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::~Map(this_02);
    operator_delete(this_02);
  }
  OpenAmulet::Map<Wrapper_Holder,_Name_Num,_std::less<Wrapper_Holder>_>::Clear(this->names);
  this_03 = this->names;
  if (this_03 != (Map<Wrapper_Holder,_Name_Num,_std::less<Wrapper_Holder>_> *)0x0) {
    OpenAmulet::Map<Wrapper_Holder,_Name_Num,_std::less<Wrapper_Holder>_>::~Map(this_03);
    operator_delete(this_03);
  }
  OpenAmulet::Map<int,_Wrapper_Holder,_std::less<int>_>::Clear(this->wrappers);
  this_04 = this->wrappers;
  if (this_04 != (Map<int,_Wrapper_Holder,_std::less<int>_> *)0x0) {
    OpenAmulet::Map<int,_Wrapper_Holder,_std::less<int>_>::~Map(this_04);
    operator_delete(this_04);
  }
  OpenAmulet::Map<Wrapper_Holder,_int,_std::less<Wrapper_Holder>_>::Clear(this->references);
  this_05 = this->references;
  if (this_05 != (Map<Wrapper_Holder,_int,_std::less<Wrapper_Holder>_> *)0x0) {
    OpenAmulet::Map<Wrapper_Holder,_int,_std::less<Wrapper_Holder>_>::~Map(this_05);
    operator_delete(this_05);
  }
  Am_Wrapper::~Am_Wrapper(&this->super_Am_Wrapper);
  return;
}

Assistant:

Am_Load_Save_Context_Data::~Am_Load_Save_Context_Data()
{
  loader->Clear();
  delete (loader);

  saver->Clear();
  delete (saver);

  prototypes->Clear();
  delete (prototypes);

  names->Clear();
  delete (names);

  wrappers->Clear();
  delete (wrappers);

  references->Clear();
  delete (references);
}